

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_processor.cc
# Opt level: O2

void __thiscall
PacketProcessor::run
          (PacketProcessor *this,
          unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *reader,bool verbose)

{
  PacketReader *pPVar1;
  pointer puVar2;
  Handler *pHVar3;
  pointer puVar4;
  int iVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  pointer puVar7;
  pointer puVar8;
  shared_ptr<lrit::File> file;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  __shared_ptr<lrit::File_const,(__gnu_cxx::_Lock_policy)2> local_3c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8;
  array<unsigned_char,_892UL> buf;
  
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Waiting for first packet...");
    std::operator<<(poVar6,"\r");
    poVar6 = (ostream *)std::ostream::flush();
    std::operator<<(poVar6,"\x1b[K");
  }
  while( true ) {
    pPVar1 = (reader->_M_t).super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>.
             _M_t.super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
             super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl;
    iVar5 = (*pPVar1->_vptr_PacketReader[2])(pPVar1,&buf);
    if ((char)iVar5 == '\0') break;
    if (verbose) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Packet:");
      poVar6 = std::operator<<(poVar6," SCID=");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 1;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(uint)(byte)(buf._M_elems[0] << 2 | buf._M_elems[1] >> 6));
      poVar6 = std::operator<<(poVar6," VCID=");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,buf._M_elems[1] & 0x3f);
      poVar6 = std::operator<<(poVar6," counter=");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
      poVar6 = std::operator<<(poVar6,0x30);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(uint)buf._M_elems[4] |
                                 (uint)buf._M_elems[3] << 8 | (uint)buf._M_elems[2] << 0x10);
      std::operator<<(poVar6,"\r");
      poVar6 = (ostream *)std::ostream::flush();
      std::operator<<(poVar6,"\x1b[K");
    }
    file.super___shared_ptr<lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&buf;
    assembler::Assembler::process
              (&spdus,&this->assembler_,
               (VCDU *)&file.super___shared_ptr<lrit::File,_(__gnu_cxx::_Lock_policy)2>);
    puVar4 = spdus.
             super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = spdus.
                  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1)
    {
      std::make_shared<lrit::File,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &file.super___shared_ptr<lrit::File,_(__gnu_cxx::_Lock_policy)2>);
      puVar2 = (this->handlers_).
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (this->handlers_).
                    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1
          ) {
        pHVar3 = (puVar8->_M_t).super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t.
                 super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                 super__Head_base<0UL,_Handler_*,_false>._M_head_impl;
        std::__shared_ptr<lrit::File_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<lrit::File,void>
                  (local_3c0,&file.super___shared_ptr<lrit::File,_(__gnu_cxx::_Lock_policy)2>);
        (**pHVar3->_vptr_Handler)(pHVar3,local_3c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&file.super___shared_ptr<lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::
    vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ::~vector(&spdus);
  }
  return;
}

Assistant:

void PacketProcessor::run(std::unique_ptr<PacketReader>& reader, bool verbose) {
  if (verbose) {
    std::cout
      << "Waiting for first packet..."
      // Carriage return to return to beginning of line
      << "\r"
      // Flush buffers
      << std::flush
      // Erase in line (expected to be buffered)
      << "\033[K";
  }

  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    if (verbose) {
      VCDU vcdu(buf);
      std::cout
        << "Packet:"
        << " SCID="
        << std::setw(1) << vcdu.getSCID()
        << " VCID="
        << std::setw(2) << vcdu.getVCID()
        << " counter="
        << std::setw(8) << std::setfill('0') << vcdu.getCounter()
        // Carriage return to return to beginning of line
        << "\r"
        // Flush buffers
        << std::flush
        // Erase in line (expected to be buffered)
        << "\033[K";
    }

    auto spdus = assembler_.process(buf);
    for (auto& spdu : spdus) {
      auto file = std::make_shared<lrit::File>(spdu->get());
      for (auto& handler : handlers_) {
        handler->handle(file);
      }
    }
  }
}